

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O2

bool __thiscall
sf::priv::ImageLoader::saveImageToMemory
          (ImageLoader *this,string *format,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  uint x;
  uint y;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string specified;
  string local_50;
  
  if ((((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) || (size->x == 0)) || (size->y == 0)) goto LAB_001578a0;
  std::__cxx11::string::string((string *)&local_50,(string *)format);
  anon_unknown.dwarf_1e5315::toLower(&specified,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  x = size->x;
  y = size->y;
  bVar1 = std::operator==(&specified,"bmp");
  if (bVar1) {
    iVar2 = stbi_write_bmp_to_func
                      (anon_unknown.dwarf_1e5315::bufferFromCallback,output,x,y,4,
                       (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start);
LAB_00157884:
    if (iVar2 != 0) {
      std::__cxx11::string::~string((string *)&specified);
      return true;
    }
  }
  else {
    bVar1 = std::operator==(&specified,"tga");
    if (bVar1) {
      iVar2 = stbi_write_tga_to_func
                        (anon_unknown.dwarf_1e5315::bufferFromCallback,output,x,y,4,
                         (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00157884;
    }
    bVar1 = std::operator==(&specified,"png");
    if (bVar1) {
      iVar2 = stbi_write_png_to_func
                        (anon_unknown.dwarf_1e5315::bufferFromCallback,output,x,y,4,
                         (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start,0);
      goto LAB_00157884;
    }
    bVar1 = std::operator==(&specified,"jpg");
    if ((bVar1) || (bVar1 = std::operator==(&specified,"jpeg"), bVar1)) {
      iVar2 = stbi_write_jpg_to_func
                        (anon_unknown.dwarf_1e5315::bufferFromCallback,output,x,y,4,
                         (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start,0x5a);
      goto LAB_00157884;
    }
  }
  std::__cxx11::string::~string((string *)&specified);
LAB_001578a0:
  poVar3 = err();
  poVar3 = std::operator<<(poVar3,"Failed to save image with format \"");
  poVar3 = std::operator<<(poVar3,(string *)format);
  poVar3 = std::operator<<(poVar3,"\"");
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool ImageLoader::saveImageToMemory(const std::string& format, std::vector<sf::Uint8>& output, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Choose function based on format

        std::string specified = toLower(format);
        const Vector2i convertedSize = Vector2i(size);

        if (specified == "bmp")
        {
            // BMP format
            if (stbi_write_bmp_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "tga")
        {
            // TGA format
            if (stbi_write_tga_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "png")
        {
            // PNG format
            if (stbi_write_png_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (specified == "jpg" || specified == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image with format \"" << format << "\"" << std::endl;
    return false;
}